

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::StartTestCase(JunitReporter *this,TestCaseInfo *testInfo)

{
  pointer *pppTVar1;
  Stats *pSVar2;
  iterator __position;
  TestCaseStats local_f0;
  
  pSVar2 = this->m_currentStats;
  TestCaseStats::TestCaseStats(&local_f0,&testInfo->className,&testInfo->name);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::emplace_back<Catch::JunitReporter::TestCaseStats>(&pSVar2->m_testCaseStats,&local_f0);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::~vector(&local_f0.m_sections);
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  ~vector(&local_f0.m_testStats);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_stdErr._M_dataplus._M_p != &local_f0.m_stdErr.field_2) {
    operator_delete(local_f0.m_stdErr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_stdOut._M_dataplus._M_p != &local_f0.m_stdOut.field_2) {
    operator_delete(local_f0.m_stdOut._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_name._M_dataplus._M_p != &local_f0.m_name.field_2) {
    operator_delete(local_f0.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_className._M_dataplus._M_p != &local_f0.m_className.field_2) {
    operator_delete(local_f0.m_className._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_status._M_dataplus._M_p != &local_f0.m_status.field_2) {
    operator_delete(local_f0.m_status._M_dataplus._M_p);
  }
  local_f0.m_timeInSeconds =
       (double)((this->m_currentStats->m_testCaseStats).
                super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1);
  __position._M_current =
       (this->m_currentTestCaseStats).
       super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_currentTestCaseStats).
      super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Catch::JunitReporter::TestCaseStats_const*,std::allocator<Catch::JunitReporter::TestCaseStats_const*>>
    ::_M_realloc_insert<Catch::JunitReporter::TestCaseStats_const*>
              ((vector<Catch::JunitReporter::TestCaseStats_const*,std::allocator<Catch::JunitReporter::TestCaseStats_const*>>
                *)&this->m_currentTestCaseStats,__position,(TestCaseStats **)&local_f0);
  }
  else {
    *__position._M_current = (TestCaseStats *)local_f0.m_timeInSeconds;
    pppTVar1 = &(this->m_currentTestCaseStats).
                super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_currentStats->m_testCaseStats.push_back( TestCaseStats( testInfo.className, testInfo.name ) );
            m_currentTestCaseStats.push_back( &m_currentStats->m_testCaseStats.back() );
        }